

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

bool __thiscall
TimesAll<0,0,0>::propagate_xy<0,0>
          (TimesAll<0,0,0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,int64_t z_min
          ,int64_t z_max)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Clause *pCVar4;
  Lit *pLVar5;
  IntVar *pIVar7;
  Clause *pCVar8;
  IntVar *pIVar9;
  undefined8 uVar10;
  _func_int **pp_Var6;
  
  pIVar7 = v.var;
  pIVar9 = u.var;
  if (z_max == 0 && z_min == 0) {
    if (v_min < 1 && -1 < v_max) {
      return true;
    }
    if (so.lazy) {
      pCVar4 = Reason_new(5);
      iVar3 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])(pIVar7);
      pLVar5 = Clause::operator[](pCVar4,1);
      pLVar5->x = iVar3;
      iVar3 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])(pIVar7);
      pLVar5 = Clause::operator[](pCVar4,2);
      pLVar5->x = iVar3;
      iVar3 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
      pLVar5 = Clause::operator[](pCVar4,3);
      pLVar5->x = iVar3;
      iVar3 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
      pLVar5 = Clause::operator[](pCVar4,4);
      pLVar5->x = iVar3;
    }
    else {
      pCVar4 = (Clause *)0x0;
    }
    if ((pIVar9->min).v < 0) {
      pCVar8 = (Clause *)0x0;
      if (so.lazy != false) {
        pCVar8 = pCVar4;
      }
      iVar3 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])(pIVar9,0,pCVar8,1);
      if ((char)iVar3 == '\0') {
        return false;
      }
    }
    if ((pIVar9->max).v < 1) {
      return true;
    }
    if (so.lazy == false) {
      pCVar4 = (Clause *)0x0;
    }
    pp_Var6 = (pIVar9->super_Var).super_Branching._vptr_Branching;
    uVar10 = 0;
LAB_0018bd9a:
    iVar3 = (*pp_Var6[0xf])(pIVar9,uVar10,pCVar4,1);
    cVar2 = (char)iVar3;
LAB_0018bdf4:
    if (cVar2 == '\0') {
      return false;
    }
  }
  else {
    if (z_min < 1) {
      if (-1 < z_max) {
        return true;
      }
      if (v_min == 0) {
        if (!so.lazy) goto LAB_0018bdcd;
        pCVar4 = Reason_new(3);
        iVar3 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
LAB_0018bc9a:
        pLVar5 = Clause::operator[](pCVar4,1);
        pLVar5->x = iVar3;
        iVar3 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[8])(pIVar7);
        pLVar5 = Clause::operator[](pCVar4,2);
        pLVar5->x = iVar3;
        goto LAB_0018bdd0;
      }
      if (v_max == 0) {
        if (!so.lazy) goto LAB_0018bd76;
        pCVar4 = Reason_new(3);
        iVar3 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
LAB_0018bd4a:
        pLVar5 = Clause::operator[](pCVar4,1);
        pLVar5->x = iVar3;
        iVar3 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[9])(pIVar7);
        pLVar5 = Clause::operator[](pCVar4,2);
        pLVar5->x = iVar3;
        goto LAB_0018bd79;
      }
    }
    else {
      if (v_min == 0) {
        if (so.lazy) {
          pCVar4 = Reason_new(3);
          iVar3 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
          goto LAB_0018bc9a;
        }
LAB_0018bdcd:
        pCVar4 = (Clause *)0x0;
LAB_0018bdd0:
        if (0 < (pIVar7->min).v) {
          return true;
        }
        if (so.lazy == false) {
          pCVar4 = (Clause *)0x0;
        }
        iVar3 = (*(pIVar7->super_Var).super_Branching._vptr_Branching[0xe])(pIVar7,1,pCVar4,1);
        cVar2 = (char)iVar3;
        goto LAB_0018bdf4;
      }
      if (v_max == 0) {
        if (so.lazy) {
          pCVar4 = Reason_new(3);
          iVar3 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
          goto LAB_0018bd4a;
        }
LAB_0018bd76:
        pCVar4 = (Clause *)0x0;
LAB_0018bd79:
        if ((pIVar7->max).v < 0) {
          return true;
        }
        if (so.lazy == false) {
          pCVar4 = (Clause *)0x0;
        }
        pp_Var6 = (pIVar7->super_Var).super_Branching._vptr_Branching;
        uVar10 = 0xffffffffffffffff;
        pIVar9 = pIVar7;
        goto LAB_0018bd9a;
      }
    }
    bVar1 = propagate_xy_min<0,0>(this,u,v,v_min,v_max,z_min,z_max);
    if ((!bVar1) || (bVar1 = propagate_xy_max<0,0>(this,u,v,v_min,v_max,z_min,z_max), !bVar1)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate_xy(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
										const int64_t z_min, const int64_t z_max) {
		if (z_min == 0 && z_max == 0) {
			// The product z equals to 0. Then x must equal to 0 too if y cannot be 0.
			if (v_min > 0 || v_max < 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(5);
					(*reason)[1] = v.getMinLit();
					(*reason)[2] = v.getMaxLit();
					(*reason)[3] = z.getMinLit();
					(*reason)[4] = z.getMaxLit();
				}
				setDom(u, setMin, 0, reason);
				setDom(u, setMax, 0, reason);
			}
		} else if (z_min > 0) {
			if (v_min == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMinLit();
					(*reason)[2] = v.getMinLit();
				}
				setDom(v, setMin, 1, reason);
			} else if (v_max == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMinLit();
					(*reason)[2] = v.getMaxLit();
				}
				setDom(v, setMax, -1, reason);
			} else {
				if (!propagate_xy_min(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
				if (!propagate_xy_max(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
			}
		} else if (z_max < 0) {
			if (v_min == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMaxLit();
					(*reason)[2] = v.getMinLit();
				}
				setDom(v, setMin, 1, reason);
			} else if (v_max == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMaxLit();
					(*reason)[2] = v.getMaxLit();
				}
				setDom(v, setMax, -1, reason);
			} else {
				if (!propagate_xy_min(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
				if (!propagate_xy_max(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
			}
		}
		return true;
	}